

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemTxResult
flatview_write(uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,MemTxAttrs attrs,void *buf,
              hwaddr len)

{
  long lVar1;
  MemTxResult MVar2;
  MemoryRegion_conflict *mr;
  uc_struct_conflict15 *uc_00;
  uint uVar3;
  uint64_t data;
  uint uVar4;
  uint uVar5;
  MemOp op;
  hwaddr *plen;
  MemTxResult result;
  uint uVar6;
  hwaddr l;
  hwaddr local_50;
  ram_addr_t local_48;
  uc_struct_conflict15 *local_40;
  hwaddr local_38;
  
  plen = &local_38;
  local_40 = uc;
  local_38 = len;
  mr = flatview_translate_tricore(uc,fv,addr,&local_48,plen,true,attrs);
  local_50 = local_38;
  uVar6 = 0;
  while( true ) {
    if ((mr->ram == false) || (mr->readonly == true)) {
      uVar3 = (mr->ops->valid).max_access_size;
      if (uVar3 == 0) {
        uVar3 = 4;
      }
      if ((mr->ops->impl).unaligned == false) {
        uVar4 = -(uint)local_48 & (uint)local_48;
        uVar5 = uVar4;
        if (uVar3 < uVar4) {
          uVar5 = uVar3;
        }
        if (uVar4 != 0) {
          uVar3 = uVar5;
        }
      }
      if (uVar3 < (uint)local_50) {
        local_50._0_4_ = uVar3;
      }
      lVar1 = 0x3f;
      if ((uint)local_50 != 0) {
        for (; (uint)local_50 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar3 = (uint)(0x8000000000000000 >> (~(byte)lVar1 & 0x3f));
      if ((uint)local_50 == 0) {
        uVar3 = 0;
      }
      local_50 = (hwaddr)(int)uVar3;
      data = 0;
      switch(uVar3) {
      case 1:
        data = (uint64_t)(byte)*buf;
        break;
      case 2:
        data = (uint64_t)(ushort)*buf;
        break;
      case 4:
        data = (uint64_t)(uint)*buf;
        break;
      case 8:
        data = *buf;
      }
      if (uVar3 == 0) {
        op = MO_ALIGN_4;
      }
      else {
        op = MO_8;
        if (uVar3 != 0) {
          for (; (uVar3 >> op & 1) == 0; op = op + MO_16) {
          }
        }
      }
      uc_00 = local_40;
      MVar2 = memory_region_dispatch_write_tricore(local_40,mr,local_48,data,op,attrs);
      uVar6 = uVar6 | MVar2;
    }
    else {
      uc_00 = (uc_struct_conflict15 *)
              qemu_ram_ptr_length((uc_struct_conflict15 *)fv->root->uc,mr->ram_block,local_48,
                                  &local_50,SUB81(plen,0));
      memcpy(uc_00,buf,local_50);
    }
    len = len - local_50;
    if (len == 0) break;
    addr = addr + local_50;
    buf = (void *)((long)buf + local_50);
    plen = &local_50;
    local_50 = len;
    mr = flatview_translate_tricore(uc_00,fv,addr,&local_48,plen,true,attrs);
  }
  return uVar6;
}

Assistant:

static MemTxResult flatview_write(struct uc_struct *uc, FlatView *fv, hwaddr addr, MemTxAttrs attrs,
                                  const void *buf, hwaddr len)
{
    hwaddr l;
    hwaddr addr1;
    MemoryRegion *mr;
    MemTxResult result = MEMTX_OK;

    l = len;
    mr = flatview_translate(uc, fv, addr, &addr1, &l, true, attrs);
    result = flatview_write_continue(uc, fv, addr, attrs, buf, len,
                                     addr1, l, mr);

    return result;
}